

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void __thiscall
Tester::reportError<char_const*,std::__cxx11::string>
          (Tester *this,string *msg,char **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string_view format_str;
  basic_string_view<char> local_58;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char **args_local;
  string *msg_local;
  Tester *this_local;
  
  local_28 = args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (char **)msg;
  msg_local = (string *)this;
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>(&local_58,msg);
  format_str.size_ = (size_t)args_local_1;
  format_str.data_ = (char *)local_58.size_;
  fmt::v5::format<char_const*,std::__cxx11::string>
            (&local_48,(v5 *)local_58.data_,format_str,(char **)local_28,in_R9);
  reportError(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void reportError(const std::string& msg, Args&&... args) {
    reportError(fmt::format(msg, args...));
  }